

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_qnames(lysp_yang_ctx *ctx,ly_stmt parent_stmt,lysp_qname **qnames,yang_arg arg,
                   lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  char *pcVar2;
  char *pcVar3;
  ly_ctx *local_f8;
  long local_f0;
  ly_ctx *local_b8;
  lysp_qname *local_b0;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  bool local_75;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_70;
  LY_ERR ret__;
  char *p__;
  size_t sStack_60;
  ly_stmt kw;
  size_t word_len;
  lysp_qname *item;
  char *word;
  char *buf;
  lysp_ext_instance **pplStack_38;
  LY_ERR ret;
  lysp_ext_instance **exts_local;
  lysp_qname **pplStack_28;
  yang_arg arg_local;
  lysp_qname **qnames_local;
  lysp_yang_ctx *plStack_18;
  ly_stmt parent_stmt_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_38 = exts;
  exts_local._4_4_ = arg;
  pplStack_28 = qnames;
  qnames_local._4_4_ = parent_stmt;
  plStack_18 = ctx;
  if (*qnames == (lysp_qname *)0x0) {
    puStack_70 = (undefined8 *)malloc(0x20);
    if (puStack_70 == (undefined8 *)0x0) {
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_90 = (ly_ctx *)0x0;
      }
      else {
        local_90 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_qnames");
      return LY_EMEM;
    }
    *puStack_70 = 1;
  }
  else {
    *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + 1;
    puStack_70 = (undefined8 *)
                 realloc(&(*qnames)[-1].flags,*(long *)&(*qnames)[-1].flags * 0x18 + 8);
    if (puStack_70 == (undefined8 *)0x0) {
      *(long *)&(*pplStack_28)[-1].flags = *(long *)&(*pplStack_28)[-1].flags + -1;
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_qnames");
      return LY_EMEM;
    }
  }
  *pplStack_28 = (lysp_qname *)(puStack_70 + 1);
  word_len = (size_t)(*pplStack_28 + *(long *)&(*pplStack_28)[-1].flags + -1);
  memset((void *)word_len,0,0x18);
  LVar1 = get_argument(plStack_18,exts_local._4_4_,(uint16_t *)(word_len + 0x10),(char **)&item,
                       &word,&stack0xffffffffffffffa0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_a0 = (ly_ctx *)0x0;
    }
    else {
      local_a0 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    if (sStack_60 == 0) {
      local_b0 = (lysp_qname *)0x254298;
    }
    else {
      local_b0 = item;
    }
    buf._4_4_ = lydict_insert(local_a0,(char *)local_b0,sStack_60,(char **)word_len);
  }
  else {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    buf._4_4_ = lydict_insert_zc(local_98,(char *)item,(char **)word_len);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    *(lyd_node **)(word_len + 8) =
         (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    buf._4_4_ = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&item,
                            &stack0xffffffffffffffa0);
    if (buf._4_4_ == LY_SUCCESS) {
      if (p__._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        local_75 = true;
      }
      else {
        if (p__._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_b8 = (ly_ctx *)0x0;
          }
          else {
            local_b8 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(p__._4_4_);
          ly_vlog(local_b8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&item,
                            &stack0xffffffffffffffa0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        local_75 = p__._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        buf._4_4_ = LY_SUCCESS;
      }
      while (!local_75) {
        if (p__._4_4_ != LY_STMT_EXTENSION_INSTANCE) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_f8 = (ly_ctx *)0x0;
          }
          else {
            local_f8 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          pcVar2 = lyplg_ext_stmt2str(p__._4_4_);
          pcVar3 = lyplg_ext_stmt2str(qnames_local._4_4_);
          ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,pcVar3);
          return LY_EVALID;
        }
        if (*pplStack_28 == (lysp_qname *)0x0) {
          local_f0 = 0;
        }
        else {
          local_f0 = *(long *)&(*pplStack_28)[-1].flags;
        }
        LVar1 = parse_ext(plStack_18,(char *)item,sStack_60,*pplStack_28,qnames_local._4_4_,
                          local_f0 - 1,pplStack_38);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        LVar1 = get_keyword(plStack_18,(ly_stmt *)((long)&p__ + 4),(char **)&item,
                            &stack0xffffffffffffffa0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = LY_SUCCESS;
        if (p__._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          local_75 = true;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_qnames(struct lysp_yang_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    struct lysp_qname *item;
    size_t word_len;
    enum ly_stmt kw;

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, arg, &item->flags, &word, &buf, &word_len));

    INSERT_WORD_GOTO(ctx, buf, item->str, word, word_len, ret, cleanup);
    item->mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, *qnames, parent_stmt, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(parent_stmt));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}